

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O2

int parse_spec(pmtr_t *cfg,UT_string *em,char *spec,in_addr_t *addr,int *port,char **iface)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  hostent *phVar5;
  size_t sVar6;
  int *piVar7;
  
  if (iface != (char **)0x0) {
    *iface = (char *)0x0;
  }
  iVar1 = strncmp(spec,"udp://",6);
  if ((iVar1 == 0) && (pcVar3 = strrchr(spec,0x3a), pcVar3 != (char *)0x0)) {
    uVar2 = atoi(pcVar3 + 1);
    *port = uVar2;
    if (uVar2 < 0x10000) {
      pcVar4 = strrchr(spec,0x40);
      if (pcVar4 != (char *)0x0 && iface != (char **)0x0) {
        *iface = pcVar4 + 1;
      }
      if (cfg->test_only != 0) {
        return 0;
      }
      pcVar4 = spec + 6;
      *pcVar3 = '\0';
      phVar5 = gethostbyname(pcVar4);
      sVar6 = strlen(pcVar4);
      *pcVar3 = ':';
      if (phVar5 == (hostent *)0x0) {
        piVar7 = __h_errno_location();
        pcVar3 = hstrerror(*piVar7);
        utstring_printf(em,"lookup [%.*s]: %s",sVar6 & 0xffffffff,pcVar4,pcVar3);
        return -2;
      }
      *addr = *(in_addr_t *)*phVar5->h_addr_list;
      return 0;
    }
  }
  utstring_printf(em,"required format: udp://1.2.3.4:5678[@eth2]");
  return -1;
}

Assistant:

static int parse_spec(pmtr_t *cfg, UT_string *em, char *spec, 
                      in_addr_t *addr, int *port, char **iface) {
  char *proto = spec, *colon, *host, *at;
  struct hostent *h;
  int hlen, rc=-1;
  if (iface) *iface = NULL;

  if (strncmp(proto, "udp://", 6)) goto done;
  host = &spec[6];

  if ( !(colon = strrchr(spec, ':'))) goto done;
  *port = atoi(colon+1);
  if ((*port < 0) || (*port > 65535)) goto done;

  if ( (at = strrchr(spec, '@')) != NULL) { // trailing @eth2
    if (iface) *iface = at+1;
  }

  /* stop here if syntax checking */
  if (cfg->test_only) return 0; 

  /* dns lookup. */
  *colon = '\0'; 
  h = gethostbyname(host); 
  hlen = strlen(host);
  *colon = ':';
  if (!h) {
    utstring_printf(em, "lookup [%.*s]: %s", hlen, host, hstrerror(h_errno));
    rc = -2;
    goto done;
  }

  *addr = ((struct in_addr*)h->h_addr)->s_addr;
  rc = 0; /* success */

 done:
  if (rc == -1) utstring_printf(em,"required format: udp://1.2.3.4:5678[@eth2]");
  return rc;
}